

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::ImageFeatureType::MergePartialFromCodedStream
          (ImageFeatureType *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  undefined8 in_RAX;
  ImageFeatureType_EnumeratedImageSizes *value_00;
  ImageFeatureType_ImageSizeRange *value_01;
  char cVar7;
  ulong uVar8;
  int64 *value_02;
  int value;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
LAB_004d3bc6:
  pbVar3 = input->buffer_;
  uVar6 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar8 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar5 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar6 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
      goto LAB_004d3cf2;
      uVar8 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar8 = uVar8 | 0x100000000;
  }
  else {
LAB_004d3cf2:
    uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
    uVar8 = 0;
    if (uVar6 - 1 < 0x3fff) {
      uVar8 = 0x100000000;
    }
    uVar8 = uVar6 | uVar8;
  }
  uVar6 = (uint32)uVar8;
  if ((uVar8 & 0x100000000) != 0) {
    uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
    cVar7 = (char)uVar8;
    if (uVar5 == 0x1f) {
      if (cVar7 != -6) goto LAB_004d3c23;
      value_01 = mutable_imagesizerange(this);
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::ImageFeatureType_ImageSizeRange>
                        (input,value_01);
      goto LAB_004d3c43;
    }
    if (uVar5 == 2) {
      value_02 = &this->height_;
      if (cVar7 == '\x10') {
LAB_004d3c88:
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,value_02);
        goto LAB_004d3c43;
      }
    }
    else {
      if (uVar5 == 3) {
        if (cVar7 != '\x18') goto LAB_004d3c23;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,(int *)((long)&uStack_38 + 4));
        if (!bVar4) {
          return false;
        }
        this->colorspace_ = uStack_38._4_4_;
        goto LAB_004d3bc6;
      }
      if (uVar5 == 0x15) {
        if (cVar7 == -0x56) {
          value_00 = mutable_enumeratedsizes(this);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::ImageFeatureType_EnumeratedImageSizes>
                            (input,value_00);
          goto LAB_004d3c43;
        }
      }
      else if ((uVar5 == 1) && (value_02 = &this->width_, cVar7 == '\b')) goto LAB_004d3c88;
    }
  }
LAB_004d3c23:
  if (uVar6 == 0) {
    return true;
  }
  if ((uVar6 & 7) == 4) {
    return true;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
LAB_004d3c43:
  if (bVar4 == false) {
    return false;
  }
  goto LAB_004d3bc6;
}

Assistant:

bool ImageFeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ImageFeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 width = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 height = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ImageFeatureType.ColorSpace colorSpace = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_colorspace(static_cast< ::CoreML::Specification::ImageFeatureType_ColorSpace >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ImageFeatureType.EnumeratedImageSizes enumeratedSizes = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_enumeratedsizes()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ImageFeatureType.ImageSizeRange imageSizeRange = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imagesizerange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ImageFeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ImageFeatureType)
  return false;
#undef DO_
}